

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

iuIParamGenerator<int> * __thiscall
iutest::detail::iuRandomParamsHolder::operator_cast_to_iuIParamGenerator_
          (iuRandomParamsHolder *this)

{
  iuIParamGenerator<int> *piVar1;
  size_t local_20;
  int local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_c = this->m_seed;
  if (local_c == 0) {
    if (GetIndefiniteValue()::s == '\0') {
      operator_cast_to_iuIParamGenerator_(this);
    }
    local_c = GetIndefiniteValue()::s * 0x19660d + 0x3c6ef35f;
    GetIndefiniteValue()::s = local_c;
  }
  local_20 = this->m_num;
  local_10 = (local_c >> 0x1e ^ local_c) * 0x6c078965 + 0x6c078965;
  local_14 = (local_10 >> 0x1e ^ local_10) * 0x6c078965 + 0xd80f12ca;
  local_18 = (local_14 >> 0x1e ^ local_14) * 0x6c078965 + 0x44169c2f;
  piVar1 = iuValuesParamsGeneratorHolder::operator_cast_to_iuIParamGenerator_
                     ((iuValuesParamsGeneratorHolder *)&local_20);
  return piVar1;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        unsigned int seed = m_seed;
        if( seed == 0 )
        {
            seed = GetIndefiniteValue();
        }
        iuValuesParamsGeneratorHolder< iuTypedRandom<T> > gen( m_num, iuTypedRandom<T>(seed) );
        return gen;
    }